

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b575::CpuTest_dec_zerox_decrements_Test::~CpuTest_dec_zerox_decrements_Test
          (CpuTest_dec_zerox_decrements_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest(&this->super_CpuTest);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuTest, dec_zerox_decrements) {
    registers.pc = expected.pc = 0x4321;
    registers.x = expected.x = 0xED;

    stage_instruction(DEC_ZEROX);
    expected.pc += 1;

    EXPECT_CALL(mmu, read_byte(0x4322)).WillOnce(Return(0x44));
    EXPECT_CALL(mmu, read_byte(0x44)).WillOnce(Return(0xCD)); // Dummy read
    EXPECT_CALL(mmu, read_byte(u16_to_u8(0x44 + 0xED))).WillOnce(Return(0x05));
    EXPECT_CALL(mmu, write_byte(u16_to_u8(0x44 + 0xED), 0x05)); // Dummy write
    EXPECT_CALL(mmu, write_byte(u16_to_u8(0x44 + 0xED), 0x04));

    step_execution(6);
    EXPECT_EQ(expected, registers);
}